

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O0

STRING_HANDLE Base64_Encode_Internal(uchar *source,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  LOGGER_LOG p_Var8;
  char *memory;
  long lVar9;
  size_t local_178;
  ulong local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  long local_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  char c2_2;
  char c1_2;
  LOGGER_LOG l_4;
  char c3_1;
  char c2_1;
  char c1_1;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  char c4;
  char c3;
  char c2;
  long lStack_58;
  char c1;
  size_t destinationPosition;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  size_t currentPosition;
  char *encoded;
  _Bool isBufferOverflow;
  size_t neededSize;
  STRING_HANDLE result;
  size_t size_local;
  uchar *source_local;
  
  bVar3 = false;
  l = (LOGGER_LOG)0x0;
  if (size == 0) {
    local_a8 = 0;
  }
  else {
    if (size == 0) {
      local_b0 = 0xffffffffffffffff;
    }
    else {
      local_b0 = size - 1;
    }
    if (local_b0 / 3 < 0xfffffffffffffffe) {
      if (size == 0) {
        local_b8 = 0xffffffffffffffff;
      }
      else {
        local_b8 = size - 1;
      }
      local_c0 = local_b8 / 3 + 1;
    }
    else {
      local_c0 = -1;
    }
    if (local_c0 == 0) {
      local_c8 = 0;
    }
    else {
      if (size == 0) {
        local_d0 = 0xffffffffffffffff;
      }
      else {
        local_d0 = size - 1;
      }
      if (local_d0 / 3 < 0xfffffffffffffffe) {
        if (size == 0) {
          local_d8 = 0xffffffffffffffff;
        }
        else {
          local_d8 = size - 1;
        }
        local_e0 = local_d8 / 3 + 1;
      }
      else {
        local_e0 = 0xffffffffffffffff;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_e0;
      if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 4) {
        local_100 = -1;
      }
      else {
        if (size == 0) {
          local_e8 = 0xffffffffffffffff;
        }
        else {
          local_e8 = size - 1;
        }
        if (local_e8 / 3 < 0xfffffffffffffffe) {
          if (size == 0) {
            local_f0 = 0xffffffffffffffff;
          }
          else {
            local_f0 = size - 1;
          }
          local_f8 = local_f0 / 3 + 1;
        }
        else {
          local_f8 = -1;
        }
        local_100 = local_f8 << 2;
      }
      local_c8 = local_100;
    }
    local_a8 = local_c8;
  }
  if (local_a8 == -1) {
    local_170 = 0xffffffffffffffff;
  }
  else {
    if (size == 0) {
      local_110 = 0;
    }
    else {
      if (size == 0) {
        local_118 = 0xffffffffffffffff;
      }
      else {
        local_118 = size - 1;
      }
      if (local_118 / 3 < 0xfffffffffffffffe) {
        if (size == 0) {
          local_120 = 0xffffffffffffffff;
        }
        else {
          local_120 = size - 1;
        }
        local_128 = local_120 / 3 + 1;
      }
      else {
        local_128 = -1;
      }
      if (local_128 == 0) {
        local_130 = 0;
      }
      else {
        if (size == 0) {
          local_138 = 0xffffffffffffffff;
        }
        else {
          local_138 = size - 1;
        }
        if (local_138 / 3 < 0xfffffffffffffffe) {
          if (size == 0) {
            local_140 = 0xffffffffffffffff;
          }
          else {
            local_140 = size - 1;
          }
          local_148 = local_140 / 3 + 1;
        }
        else {
          local_148 = 0xffffffffffffffff;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_148;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 4) {
          local_168 = 0xffffffffffffffff;
        }
        else {
          if (size == 0) {
            local_150 = 0xffffffffffffffff;
          }
          else {
            local_150 = size - 1;
          }
          if (local_150 / 3 < 0xfffffffffffffffe) {
            if (size == 0) {
              local_158 = 0xffffffffffffffff;
            }
            else {
              local_158 = size - 1;
            }
            local_160 = local_158 / 3 + 1;
          }
          else {
            local_160 = -1;
          }
          local_168 = local_160 << 2;
        }
        local_130 = local_168;
      }
      local_110 = local_130;
    }
    local_170 = local_110;
  }
  if (local_170 < 0xfffffffffffffffe) {
    local_178 = local_170 + 1;
  }
  else {
    local_178 = 0xffffffffffffffff;
  }
  if ((local_178 == 0) || (local_178 == 0xffffffffffffffff)) {
    neededSize = 0;
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                ,"Base64_Encode_Internal",0xf9,1,
                "Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.",local_178);
    }
  }
  else {
    memory = (char *)malloc(local_178);
    if (memory == (char *)0x0) {
      neededSize = 0;
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",0xff,1,"Azure_Base64_Encode:: Allocation failed.");
      }
    }
    else {
      lStack_58 = 0;
      while (2 < size - (long)l) {
        cVar4 = base64char((uchar)((int)(uint)source[(long)l] >> 2));
        cVar5 = base64char((source[(long)l] & 3) << 4 |
                           (byte)((int)(uint)(source + 1)[(long)l] >> 4));
        cVar6 = base64char(((source + 1)[(long)l] & 0xf) << 2 |
                           (byte)((int)(uint)(source + 2)[(long)l] >> 6));
        cVar7 = base64char((source + 2)[(long)l] & 0x3f);
        l = l + 3;
        if (local_178 < lStack_58 + 4U) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                      ,"Base64_Encode_Internal",0x11b,1,"Azure_Base64_Encode:: Invalid buffer size."
                     );
          }
          bVar3 = true;
          break;
        }
        memory[lStack_58] = cVar4;
        memory[lStack_58 + 1] = cVar5;
        lVar9 = lStack_58 + 3;
        memory[lStack_58 + 2] = cVar6;
        lStack_58 = lStack_58 + 4;
        memory[lVar9] = cVar7;
      }
      if ((bVar3) || (size - (long)l != 2)) {
        if ((!bVar3) && (size - (long)l == 1)) {
          if (local_178 < lStack_58 + 4U) {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                        ,"Base64_Encode_Internal",0x13f,1,
                        "Azure_Base64_Encode:: Invalid buffer size.");
            }
            bVar3 = true;
          }
          else {
            cVar4 = base64char((uchar)((int)(uint)source[(long)l] >> 2));
            cVar5 = base64b8(source[(long)l] & 3);
            memory[lStack_58] = cVar4;
            memory[lStack_58 + 1] = cVar5;
            lVar9 = lStack_58 + 3;
            memory[lStack_58 + 2] = '=';
            lStack_58 = lStack_58 + 4;
            memory[lVar9] = '=';
          }
        }
      }
      else if (local_178 < lStack_58 + 4U) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                    ,"Base64_Encode_Internal",0x12a,1,"Azure_Base64_Encode:: Invalid buffer size.");
        }
        bVar3 = true;
      }
      else {
        cVar4 = base64char((uchar)((int)(uint)source[(long)l] >> 2));
        cVar5 = base64char((source[(long)l] & 3) << 4 |
                           (byte)((int)(uint)(source + 1)[(long)l] >> 4));
        cVar6 = base64b16((source + 1)[(long)l] & 0xf);
        memory[lStack_58] = cVar4;
        memory[lStack_58 + 1] = cVar5;
        lVar9 = lStack_58 + 3;
        memory[lStack_58 + 2] = cVar6;
        lStack_58 = lStack_58 + 4;
        memory[lVar9] = '=';
      }
      if (!bVar3) {
        if (local_178 < lStack_58 + 1U) {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                      ,"Base64_Encode_Internal",0x152,1,"Azure_Base64_Encode:: Invalid buffer size."
                     );
          }
          bVar3 = true;
        }
        else {
          memory[lStack_58] = '\0';
        }
      }
      if (bVar3) {
        free(memory);
        neededSize = 0;
      }
      else {
        neededSize = (size_t)STRING_new_with_memory(memory);
        if ((STRING_HANDLE)neededSize == (STRING_HANDLE)0x0) {
          free(memory);
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            (*p_Var8)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                      ,"Base64_Encode_Internal",0x167,1,
                      "Azure_Base64_Encode:: Allocation failed for return value.");
          }
        }
      }
    }
  }
  return (STRING_HANDLE)neededSize;
}

Assistant:

static STRING_HANDLE Base64_Encode_Internal(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    size_t neededSize = 0;
    bool isBufferOverflow = false;
    char* encoded;
    size_t currentPosition = 0;
    neededSize = safe_add_size_t(neededSize, (size == 0) ? (0) : safe_multiply_size_t(safe_add_size_t(((safe_subtract_size_t(size, 1)) / 3), 1), 4));
    neededSize = safe_add_size_t(neededSize, 1);  /*+1 because \0 at the end of the string*/

    if (neededSize == 0 || neededSize == SIZE_MAX)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.", neededSize);
    }
    /*Codes_SRS_BASE64_06_006: [If when allocating memory to produce the encoding a failure occurs then Azure_Base64_Encode shall return NULL.]*/
    else if ((encoded = (char*)malloc(neededSize)) == NULL)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Allocation failed.");
    }
    else
    {
        /*b0            b1(+1)          b2(+2)
        7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0
        |----c1---| |----c2---| |----c3---| |----c4---|
        */

        size_t destinationPosition = 0;
        while (size - currentPosition >= 3)
        {
            char c1 = base64char(source[currentPosition] >> 2);
            char c2 = base64char(
                ((source[currentPosition] & 3) << 4) |
                    (source[currentPosition + 1] >> 4)
            );
            char c3 = base64char(
                ((source[currentPosition + 1] & 0x0F) << 2) |
                    ((source[currentPosition + 2] >> 6) & 3)
            );
            char c4 = base64char(
                source[currentPosition + 2] & 0x3F
            );
            currentPosition += 3;

            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
                break;
            }
            encoded[destinationPosition++] = c1;
            encoded[destinationPosition++] = c2;
            encoded[destinationPosition++] = c3;
            encoded[destinationPosition++] = c4;

        }

        if (!isBufferOverflow && size - currentPosition == 2)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64char(
                    ((source[currentPosition] & 0x03) << 4) |
                    (source[currentPosition + 1] >> 4)
                );
                char c3 = base64b16(source[currentPosition + 1] & 0x0F);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = c3;
                encoded[destinationPosition++] = '=';
            }
        }
        else if (!isBufferOverflow && size - currentPosition == 1)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64b8(source[currentPosition] & 0x03);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = '=';
                encoded[destinationPosition++] = '=';
            }
        }

        /*null terminating the string*/
        if (!isBufferOverflow)
        {
            if ((destinationPosition + 1) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                encoded[destinationPosition] = '\0';
            }
        }

        if (isBufferOverflow)
        {
            free(encoded);
            result = NULL;
        }
        else
        {
            /*Codes_SRS_BASE64_06_007: [Otherwise Azure_Base64_Encode shall return a pointer to STRING, that string contains the base 64 encoding of input.]*/
            result = STRING_new_with_memory(encoded);
            if (result == NULL)
            {
                free(encoded);
                LogError("Azure_Base64_Encode:: Allocation failed for return value.");
            }
        }
    }
    return result;
}